

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

void Omega_h::transfer_conserve_refine
               (Mesh *old_mesh,TransferOpts *opts,Mesh *new_mesh,LOs *keys2edges,LOs *keys2prods,
               LOs *prods2new_ents,LOs same_ents2old_ents,LOs same_ents2new_ents)

{
  LOs same_ents2old_ents_00;
  LOs same_ents2new_ents_00;
  bool bVar1;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe14;
  OpConservation in_stack_fffffffffffffe18;
  undefined1 local_1d8 [32];
  Write<int> local_1b8;
  Write<int> local_1a8;
  Write<int> local_198;
  Cavs local_188;
  Cavs init_cavs;
  CavsByBdryStatus cavs;
  
  bVar1 = should_conserve_any(old_mesh,opts);
  if (bVar1) {
    Write<int>::Write(&local_1a8,&keys2edges->write_);
    Write<int>::Write(&local_1b8,&keys2prods->write_);
    Write<int>::Write(&local_198,&prods2new_ents->write_);
    form_initial_cavs(&init_cavs,old_mesh,new_mesh,1,(LOs *)&local_1a8,(LOs *)&local_1b8,
                      (LOs *)&local_198);
    Write<int>::~Write(&local_198);
    Write<int>::~Write(&local_1b8);
    Write<int>::~Write(&local_1a8);
    Cavs::Cavs(&local_188,&init_cavs);
    Write<int>::Write((Write<int> *)(local_1d8 + 0x10),&keys2edges->write_);
    separate_cavities(&cavs,old_mesh,new_mesh,&local_188,1,(LOs *)(local_1d8 + 0x10),(Graph *)0x0);
    Write<int>::~Write((Write<int> *)(local_1d8 + 0x10));
    Cavs::~Cavs(&local_188);
    Write<int>::Write((Write<int> *)local_1d8,
                      (Write<int> *)same_ents2old_ents.write_.shared_alloc_.alloc);
    Write<int>::Write((Write<int> *)&stack0xfffffffffffffe18,
                      (Write<int> *)same_ents2old_ents.write_.shared_alloc_.direct_ptr);
    same_ents2old_ents_00.write_.shared_alloc_.direct_ptr._0_4_ = 1;
    same_ents2old_ents_00.write_.shared_alloc_.alloc = (Alloc *)0x101000001010101;
    same_ents2old_ents_00.write_.shared_alloc_.direct_ptr._4_4_ = in_stack_fffffffffffffe04;
    same_ents2new_ents_00.write_.shared_alloc_.direct_ptr._0_4_ = 1;
    same_ents2new_ents_00.write_.shared_alloc_.alloc = (Alloc *)0x101000001010101;
    same_ents2new_ents_00.write_.shared_alloc_.direct_ptr._4_4_ = in_stack_fffffffffffffe14;
    transfer_conservation_errors
              ((Omega_h *)old_mesh,(Mesh *)opts,(TransferOpts *)new_mesh,(Mesh *)&cavs,
               (CavsByBdryStatus *)local_1d8,same_ents2old_ents_00,same_ents2new_ents_00,
               in_stack_fffffffffffffe18);
    Write<int>::~Write((Write<int> *)&stack0xfffffffffffffe18);
    Write<int>::~Write((Write<int> *)local_1d8);
    std::array<std::array<std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>,_3UL>,_3UL>::
    ~array(&cavs);
    Cavs::~Cavs(&init_cavs);
  }
  return;
}

Assistant:

void transfer_conserve_refine(Mesh* old_mesh, TransferOpts const& opts,
    Mesh* new_mesh, LOs keys2edges, LOs keys2prods, LOs prods2new_ents,
    LOs same_ents2old_ents, LOs same_ents2new_ents) {
  if (!should_conserve_any(old_mesh, opts)) return;
  auto init_cavs = form_initial_cavs(
      old_mesh, new_mesh, EDGE, keys2edges, keys2prods, prods2new_ents);
  auto cavs =
      separate_cavities(old_mesh, new_mesh, init_cavs, EDGE, keys2edges);
  OpConservation op_conservation;
  op_conservation.density.this_time[NOT_BDRY] = true;
  op_conservation.density.this_time[TOUCH_BDRY] = true;
  op_conservation.density.this_time[KEY_BDRY] = true;
  op_conservation.momentum.this_time[NOT_BDRY] = true;
  op_conservation.momentum.this_time[TOUCH_BDRY] = true;
  op_conservation.momentum.this_time[KEY_BDRY] = true;
  transfer_conservation_errors(old_mesh, opts, new_mesh, cavs,
      same_ents2old_ents, same_ents2new_ents, op_conservation);
}